

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Type * __thiscall
soul::heart::IODeclaration::getSampleArrayType
          (Type *__return_storage_ptr__,IODeclaration *this,Type *t)

{
  bool bVar1;
  uint *puVar2;
  Type *t_local;
  IODeclaration *this_local;
  
  bVar1 = std::optional<unsigned_int>::has_value(&this->arraySize);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::operator*(&this->arraySize);
    Type::createArray(__return_storage_ptr__,t,(ulong)*puVar2);
  }
  else {
    Type::Type(__return_storage_ptr__,t);
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSampleArrayType (Type t) const
        {
            return arraySize.has_value() ? t.createArray (*arraySize) : t;
        }